

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O0

void __thiscall Memory::HeapAllocator::ClearTrackAllocInfo(HeapAllocator *this,TrackAllocData *data)

{
  code *pcVar1;
  bool bVar2;
  TrackAllocData *pTVar3;
  undefined4 *puVar4;
  void *__src;
  TrackAllocData *data_local;
  HeapAllocator *this_local;
  
  pTVar3 = (TrackAllocData *)nextAllocData();
  bVar2 = TrackAllocData::IsEmpty(pTVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapAllocator.cpp"
                       ,0xd3,"(!nextAllocData.IsEmpty())","!nextAllocData.IsEmpty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (data != (TrackAllocData *)0x0) {
    __src = (void *)nextAllocData();
    memcpy(data,__src,0x28);
  }
  pTVar3 = (TrackAllocData *)nextAllocData();
  TrackAllocData::Clear(pTVar3);
  return;
}

Assistant:

void HeapAllocator::ClearTrackAllocInfo(TrackAllocData* data/* = NULL*/)
{
#ifdef HEAP_TRACK_ALLOC
    Assert(!nextAllocData.IsEmpty());
    if (data)
    {
        *data = nextAllocData;
    }
    nextAllocData.Clear();
#endif
}